

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

TimerImpl * __thiscall
PoolList<Server::Private::TimerImpl>::linkFreeItem
          (PoolList<Server::Private::TimerImpl> *this,TimerImpl *t)

{
  Item *pIVar1;
  Item *pIVar2;
  PoolList<Server::Private::TimerImpl> *pPVar3;
  
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pPVar3 = (PoolList<Server::Private::TimerImpl> *)pIVar1->prev;
  pIVar2->prev = (Item *)pPVar3;
  if (pPVar3 == (PoolList<Server::Private::TimerImpl> *)0x0) {
    pPVar3 = this;
  }
  (pPVar3->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return t;
}

Assistant:

T& linkFreeItem(T* t)
  {
    Item* item = freeItem;
    freeItem = item->prev;
    Item* insertPos = _end.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;
    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return *t;
  }